

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFCopyDescriptor.cpp
# Opt level: O1

void amrex::InterpAddBox(MultiFabCopyDescriptor *fabCopyDesc,BoxList *returnUnfilledBoxes,
                        Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>
                        *returnedFillBoxIds,Box *subbox,MultiFabId faid1,MultiFabId faid2,Real t1,
                        Real t2,Real t,int src_comp,int dest_comp,int num_comp,bool extrap)

{
  pointer pFVar1;
  double dVar2;
  FillBoxId local_74;
  BoxList tempUnfilledBoxes;
  
  dVar2 = (t2 - t1) / 1000.0;
  if ((t < t1 - dVar2) || (t1 + dVar2 < t)) {
    if ((t <= t2 - dVar2) || (dVar2 + t2 <= t)) {
      std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
                (&returnedFillBoxIds->
                  super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,2);
      BoxList::BoxList(&tempUnfilledBoxes,(IndexType)(subbox->btype).itype);
      FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                (&local_74,&fabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,
                 (FabArrayId)faid1.fabArrayId,subbox,returnUnfilledBoxes,src_comp,dest_comp,num_comp
                );
      pFVar1 = (returnedFillBoxIds->
               super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
               super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar1->m_fabIndex = local_74.m_fabIndex;
      *(ulong *)((long)&(pFVar1->m_fillBox).bigend + 4) =
           CONCAT44(local_74.m_fillBox.bigend.vect[2],local_74.m_fillBox.bigend.vect[1]);
      *(ulong *)&(pFVar1->m_fillBox).btype =
           CONCAT44(local_74.m_fillBoxId,local_74.m_fillBox.btype.itype);
      *(ulong *)&(pFVar1->m_fillBox).smallend =
           CONCAT44(local_74.m_fillBox.smallend.vect[1],local_74.m_fillBox.smallend.vect[0]);
      *(ulong *)((long)&(pFVar1->m_fillBox).smallend + 8) =
           CONCAT44(local_74.m_fillBox.bigend.vect[0],local_74.m_fillBox.smallend.vect[2]);
      FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                (&local_74,&fabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,
                 (FabArrayId)faid2.fabArrayId,subbox,&tempUnfilledBoxes,src_comp,dest_comp,num_comp)
      ;
      pFVar1 = (returnedFillBoxIds->
               super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
               super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar1[1].m_fabIndex = local_74.m_fabIndex;
      *(ulong *)((long)&pFVar1[1].m_fillBox.bigend + 4) =
           CONCAT44(local_74.m_fillBox.bigend.vect[2],local_74.m_fillBox.bigend.vect[1]);
      *(ulong *)&pFVar1[1].m_fillBox.btype =
           CONCAT44(local_74.m_fillBoxId,local_74.m_fillBox.btype.itype);
      *(ulong *)&pFVar1[1].m_fillBox.smallend =
           CONCAT44(local_74.m_fillBox.smallend.vect[1],local_74.m_fillBox.smallend.vect[0]);
      *(ulong *)((long)&pFVar1[1].m_fillBox.smallend + 8) =
           CONCAT44(local_74.m_fillBox.bigend.vect[0],local_74.m_fillBox.smallend.vect[2]);
      if (tempUnfilledBoxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      operator_delete(tempUnfilledBoxes.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                      .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)tempUnfilledBoxes.m_lbox.
                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)tempUnfilledBoxes.m_lbox.
                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
    std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
              (&returnedFillBoxIds->
                super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,1);
    FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
              (&local_74,&fabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,
               (FabArrayId)faid2.fabArrayId,subbox,returnUnfilledBoxes,src_comp,dest_comp,num_comp);
    pFVar1 = (returnedFillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>)
             .super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1->m_fabIndex = local_74.m_fabIndex;
  }
  else {
    std::vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::resize
              (&returnedFillBoxIds->
                super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,1);
    FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
              (&local_74,&fabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,
               (FabArrayId)faid1.fabArrayId,subbox,returnUnfilledBoxes,src_comp,dest_comp,num_comp);
    pFVar1 = (returnedFillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>)
             .super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1->m_fabIndex = local_74.m_fabIndex;
  }
  *(int *)((long)&(pFVar1->m_fillBox).bigend + 4) = local_74.m_fillBox.bigend.vect[1];
  *(int *)((long)&(pFVar1->m_fillBox).bigend + 8) = local_74.m_fillBox.bigend.vect[2];
  (pFVar1->m_fillBox).btype.itype = local_74.m_fillBox.btype.itype;
  pFVar1->m_fillBoxId = local_74.m_fillBoxId;
  (pFVar1->m_fillBox).smallend.vect[0] = local_74.m_fillBox.smallend.vect[0];
  *(int *)((long)&(pFVar1->m_fillBox).smallend + 4) = local_74.m_fillBox.smallend.vect[1];
  *(int *)((long)&(pFVar1->m_fillBox).smallend + 8) = local_74.m_fillBox.smallend.vect[2];
  (pFVar1->m_fillBox).bigend.vect[0] = local_74.m_fillBox.bigend.vect[0];
  return;
}

Assistant:

void
InterpAddBox (MultiFabCopyDescriptor& fabCopyDesc,
              BoxList*                returnUnfilledBoxes,
              Vector<FillBoxId>&       returnedFillBoxIds,
              const Box&              subbox,
              MultiFabId              faid1,
              MultiFabId              faid2,
              Real                    t1,
              Real                    t2,
              Real                    t,
              int                     src_comp,
              int                     dest_comp,
              int                     num_comp,
              bool                    extrap)
{
    amrex::ignore_unused(extrap);

    const Real teps = (t2-t1)/1000.0_rt;

    BL_ASSERT(extrap || ( (t>=t1-teps) && (t <= t2+teps) ) );

    if (t >= t1-teps && t <= t1+teps)
    {
        returnedFillBoxIds.resize(1);
        returnedFillBoxIds[0] = fabCopyDesc.AddBox(faid1,
                                                   subbox,
                                                   returnUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
    }
    else if (t > t2-teps && t < t2+teps)
    {
        returnedFillBoxIds.resize(1);
        returnedFillBoxIds[0] = fabCopyDesc.AddBox(faid2,
                                                   subbox,
                                                   returnUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
    }
    else
    {
        returnedFillBoxIds.resize(2);
        BoxList tempUnfilledBoxes(subbox.ixType());
        returnedFillBoxIds[0] = fabCopyDesc.AddBox(faid1,
                                                   subbox,
                                                   returnUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
        returnedFillBoxIds[1] = fabCopyDesc.AddBox(faid2,
                                                   subbox,
                                                   &tempUnfilledBoxes,
                                                   src_comp,
                                                   dest_comp,
                                                   num_comp);
        //
        // The boxarrays for faid1 and faid2 should be the
        // same so only use returnUnfilledBoxes from one AddBox here.
        //
    }
}